

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

string * __thiscall
LTAircraft::FlightPhase2String_abi_cxx11_
          (string *__return_storage_ptr__,LTAircraft *this,flightPhaseE phase)

{
  int iVar1;
  char *__s;
  allocator<char> local_9;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 0x3c:
    __s = "Approach";
    break;
  case 0x3d:
    __s = "Final";
    break;
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
    goto switchD_00143eba_caseD_19;
  case 0x46:
    __s = "Landing";
    break;
  case 0x47:
    __s = "Flare";
    break;
  case 0x48:
    __s = "Touch Down";
    break;
  case 0x49:
    __s = "Roll Out";
    break;
  case 0x4a:
    __s = "Stopped";
    break;
  default:
    switch(iVar1) {
    case 0x14:
      __s = "Take Off";
      break;
    case 0x15:
      __s = "Take Off Roll";
      break;
    case 0x16:
      __s = "Rotate";
      break;
    case 0x17:
      __s = "Lift Off";
      break;
    case 0x18:
      __s = "Initial Climb";
      break;
    case 0x1e:
      __s = "Climb";
      break;
    default:
      if (iVar1 == 0x32) {
        __s = "Descend";
        break;
      }
      if (iVar1 == 5) {
        __s = "Parked";
        break;
      }
      if (iVar1 == 10) {
        __s = "Taxi";
        break;
      }
      if (iVar1 == 0x28) {
        __s = "Cruise";
        break;
      }
      if (iVar1 == 0) {
        __s = "Unknown";
        break;
      }
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
switchD_00143eba_caseD_19:
      __s = "?";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string LTAircraft::FlightPhase2String (flightPhaseE phase)
{
    switch (phase) {
        case FPH_UNKNOWN:           return "Unknown";
        case FPH_PARKED:            return "Parked";
        case FPH_TAXI:              return "Taxi";
        case FPH_TAKE_OFF:          return "Take Off";
        case FPH_TO_ROLL:           return "Take Off Roll";
        case FPH_ROTATE:            return "Rotate";
        case FPH_LIFT_OFF:          return "Lift Off";
        case FPH_INITIAL_CLIMB:     return "Initial Climb";
        case FPH_CLIMB:             return "Climb";
        case FPH_CRUISE:            return "Cruise";
        case FPH_DESCEND:           return "Descend";
        case FPH_APPROACH:          return "Approach";
        case FPH_FINAL:             return "Final";
        case FPH_LANDING:           return "Landing";
        case FPH_FLARE:             return "Flare";
        case FPH_TOUCH_DOWN:        return "Touch Down";
        case FPH_ROLL_OUT:          return "Roll Out";
        case FPH_STOPPED_ON_RWY:    return "Stopped";
    }
    // must not get here...then we missed a value in the above switch
    LOG_ASSERT(phase!=FPH_UNKNOWN);
    return "?";
}